

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

uint32_t cpu_ldl_data_mips64(CPUArchState_conflict11 *env,target_ulong ptr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0xa3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0xa0;
  }
  uVar1 = load_helper(env,ptr,oi,0,MO_BEUL,false,full_be_ldul_mmu);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t cpu_ldl_data(CPUArchState *env, target_ulong ptr)
{
    return cpu_ldl_data_ra(env, ptr, 0);
}